

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O0

void __thiscall GB::ld_a_mnn(GB *this)

{
  long lVar1;
  u8 uVar2;
  GB *this_local;
  
  lVar1 = (this->s).op_tick;
  if (lVar1 == 0xe) {
    uVar2 = read_n(this);
    (this->s).field_6.field_0.z = uVar2;
  }
  else if (lVar1 == 0x16) {
    uVar2 = read_n(this);
    (this->s).field_6.field_0.w = uVar2;
  }
  else if (lVar1 == 0x1e) {
    uVar2 = Read(this,(this->s).field_6.wz);
    (this->s).field_2.field_0.a = uVar2;
    op_done(this);
  }
  return;
}

Assistant:

void GB::ld_a_mnn() {
  switch (s.op_tick) {
    case 14: s.z = read_n(); break;
    case 22: s.w = read_n(); break;
    case 30: s.a = Read(s.wz); op_done(); break;
  }
}